

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

uint8 * load_jpeg_image(jpeg *z,int *out_x,int *out_y,int *comp,int req_comp)

{
  anon_struct_72_14_dbcb52e3 *paVar1;
  uint8 uVar2;
  int iVar3;
  uint32 uVar4;
  undefined8 uVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  void *pvVar13;
  code *pcVar14;
  uint8 *puVar15;
  bool bVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  int *piVar20;
  int iVar21;
  long lVar22;
  int *piVar23;
  anon_struct_72_14_dbcb52e3 *paVar24;
  long lVar25;
  int iVar26;
  int iVar27;
  uint8 *puVar28;
  ulong uVar29;
  uint8 *coutput [4];
  short data [64];
  short *local_158;
  void *local_118;
  long local_110;
  long local_108;
  short local_f8 [20];
  int local_d0 [40];
  
  if (4 < (uint)req_comp) {
    failure_reason = "Internal error";
    return (uint8 *)0x0;
  }
  (z->s).img_n = 0;
  z->restart_interval = 0;
  iVar8 = decode_jpeg_header(z,0);
  if (iVar8 != 0) {
    bVar6 = get_marker(z);
    paVar1 = z->img_comp;
    local_158 = local_f8;
    while (bVar6 != 0xda) {
      if (bVar6 == 0xd9) {
        if (req_comp == 0) {
          req_comp = (z->s).img_n;
        }
        uVar17 = (z->s).img_n;
        uVar9 = 1;
        if (2 < req_comp) {
          uVar9 = uVar17;
        }
        if (uVar17 != 3) {
          uVar9 = uVar17;
        }
        if (0 < (int)uVar9) {
          lVar22 = 0;
          do {
            uVar4 = (z->s).img_x;
            pvVar13 = malloc((ulong)(uVar4 + 3));
            *(void **)((long)&z->img_comp[0].linebuf + lVar22) = pvVar13;
            if (pvVar13 == (void *)0x0) {
              cleanup_jpeg(z);
              failure_reason = "Out of memory";
            }
            else {
              uVar29 = (long)z->img_h_max / (long)*(int *)((long)&z->img_comp[0].h + lVar22);
              uVar17 = (uint)uVar29;
              *(uint *)(local_158 + 0xc) = uVar17;
              uVar11 = z->img_v_max / *(int *)((long)&z->img_comp[0].v + lVar22);
              *(uint *)(local_158 + 0xe) = uVar11;
              *(int *)(local_158 + 0x12) = (int)uVar11 >> 1;
              *(int *)(local_158 + 0x10) =
                   (int)((ulong)((uVar4 + uVar17) - 1) / (uVar29 & 0xffffffff));
              local_158[0x14] = 0;
              local_158[0x15] = 0;
              uVar5 = *(undefined8 *)((long)&z->img_comp[0].data + lVar22);
              *(undefined8 *)(local_158 + 8) = uVar5;
              *(undefined8 *)(local_158 + 4) = uVar5;
              if ((uVar17 ^ 1) == 0 && (uVar11 ^ 1) == 0) {
                pcVar14 = resample_row_1;
              }
              else if ((uVar17 ^ 1) == 0 && (uVar11 ^ 2) == 0) {
                pcVar14 = resample_row_v_2;
              }
              else if ((uVar11 ^ 1) == 0 && (uVar17 ^ 2) == 0) {
                pcVar14 = resample_row_h_2;
              }
              else if ((uVar17 ^ 2) == 0 && (uVar11 ^ 2) == 0) {
                pcVar14 = resample_row_hv_2;
              }
              else {
                pcVar14 = resample_row_generic;
              }
              *(code **)local_158 = pcVar14;
            }
            if (pvVar13 == (void *)0x0) {
              return (uint8 *)0x0;
            }
            lVar22 = lVar22 + 0x48;
            local_158 = local_158 + 0x18;
          } while ((ulong)uVar9 * 0x48 != lVar22);
        }
        puVar15 = (uint8 *)malloc((ulong)((z->s).img_x * req_comp * (z->s).img_y + 1));
        if (puVar15 == (uint8 *)0x0) {
          cleanup_jpeg(z);
          failure_reason = "Out of memory";
          return (uint8 *)0x0;
        }
        if ((z->s).img_y != 0) {
          iVar8 = 0;
          uVar17 = 0;
          do {
            uVar4 = (z->s).img_x;
            if (0 < (int)uVar9) {
              piVar20 = local_d0;
              uVar29 = 0;
              piVar23 = &z->img_comp[0].y;
              do {
                iVar19 = piVar20[-1];
                iVar26 = piVar20[-3];
                iVar12 = iVar26 >> 1;
                pvVar13 = (void *)(**(code **)(piVar20 + -10))
                                            (*(uint8 **)(piVar23 + 8),
                                             *(undefined8 *)
                                              ((long)piVar20 +
                                              ((ulong)(iVar12 <= iVar19) << 3 | 0xffffffffffffffe0))
                                             ,*(undefined8 *)
                                               ((long)piVar20 +
                                               ((ulong)(iVar19 < iVar12) << 3 | 0xffffffffffffffe0))
                                             ,piVar20[-2],piVar20[-4]);
                (&local_118)[uVar29] = pvVar13;
                piVar20[-1] = iVar19 + 1;
                if (iVar26 <= iVar19 + 1) {
                  piVar20[-1] = 0;
                  *(long *)(piVar20 + -8) = *(long *)(piVar20 + -6);
                  iVar19 = *piVar20;
                  *piVar20 = iVar19 + 1;
                  if (iVar19 + 1 < *piVar23) {
                    *(long *)(piVar20 + -6) = *(long *)(piVar20 + -6) + (long)piVar23[1];
                  }
                }
                uVar29 = uVar29 + 1;
                piVar23 = piVar23 + 0x12;
                piVar20 = piVar20 + 0xc;
              } while (uVar9 != uVar29);
            }
            if (req_comp < 3) {
              uVar29 = (ulong)(z->s).img_x;
              if (req_comp == 1) {
                if (uVar29 != 0) {
                  memcpy(puVar15 + uVar17 * uVar4,local_118,uVar29);
                }
              }
              else if (uVar29 != 0) {
                uVar18 = 0;
                do {
                  puVar15[uVar18 * 2 + (ulong)(uVar4 * iVar8)] =
                       *(uint8 *)((long)local_118 + uVar18);
                  puVar15[uVar18 * 2 + (ulong)(uVar4 * iVar8) + 1] = 0xff;
                  uVar18 = uVar18 + 1;
                } while (uVar29 != uVar18);
              }
            }
            else if ((z->s).img_n == 3) {
              lVar22 = (long)(int)(z->s).img_x;
              if (0 < lVar22) {
                puVar28 = puVar15 + (ulong)(uVar4 * iVar8) + 3;
                lVar25 = 0;
                do {
                  iVar12 = (uint)*(byte *)((long)local_118 + lVar25) * 0x10000;
                  iVar19 = *(byte *)(local_108 + lVar25) - 0x80;
                  iVar26 = iVar19 * 0x166e9 + iVar12 + 0x8000 >> 0x10;
                  if (iVar26 < 1) {
                    iVar26 = 0;
                  }
                  if (0xfe < iVar26) {
                    iVar26 = 0xff;
                  }
                  iVar21 = *(byte *)(local_110 + lVar25) - 0x80;
                  iVar19 = iVar21 * -0x581a + iVar19 * -0xb6d2 + iVar12 + 0x8000;
                  if (iVar19 >> 0x10 < 1) {
                    iVar19 = 0;
                  }
                  iVar19 = iVar19 >> 0x10;
                  if (0xfe < iVar19) {
                    iVar19 = 0xff;
                  }
                  iVar21 = iVar12 + iVar21 * 0x1c5a2 + 0x8000 >> 0x10;
                  iVar12 = 0;
                  if (0 < iVar21) {
                    iVar12 = iVar21;
                  }
                  if (0xfe < iVar12) {
                    iVar12 = 0xff;
                  }
                  puVar28[-3] = (uint8)iVar26;
                  puVar28[-2] = (uint8)iVar19;
                  puVar28[-1] = (uint8)iVar12;
                  *puVar28 = 0xff;
                  lVar25 = lVar25 + 1;
                  puVar28 = puVar28 + (uint)req_comp;
                } while (lVar22 != lVar25);
              }
            }
            else {
              uVar29 = (ulong)(z->s).img_x;
              if (uVar29 != 0) {
                puVar28 = puVar15 + (ulong)(uVar4 * iVar8) + 3;
                uVar18 = 0;
                do {
                  uVar2 = *(uint8 *)((long)local_118 + uVar18);
                  puVar28[-1] = uVar2;
                  puVar28[-2] = uVar2;
                  puVar28[-3] = uVar2;
                  *puVar28 = 0xff;
                  uVar18 = uVar18 + 1;
                  puVar28 = puVar28 + (uint)req_comp;
                } while (uVar29 != uVar18);
              }
            }
            uVar17 = uVar17 + 1;
            iVar8 = iVar8 + req_comp;
          } while (uVar17 < (z->s).img_y);
        }
        cleanup_jpeg(z);
        *out_x = (z->s).img_x;
        *out_y = (z->s).img_y;
        if (comp != (int *)0x0) {
          *comp = (z->s).img_n;
          return puVar15;
        }
        return puVar15;
      }
      iVar8 = process_marker(z,(uint)bVar6);
LAB_001555eb:
      if (iVar8 == 0) goto LAB_00155b38;
      bVar6 = get_marker(z);
    }
    iVar8 = get8(&z->s);
    iVar19 = get8(&z->s);
    iVar26 = get8(&z->s);
    z->scan_n = iVar26;
    if (((0xfffffffb < iVar26 - 5U) && (iVar26 <= (z->s).img_n)) &&
       (iVar8 * 0x100 + iVar19 == iVar26 * 2 + 6)) {
      if (0 < iVar26) {
        lVar22 = 0;
        do {
          iVar8 = get8(&z->s);
          uVar9 = get8(&z->s);
          uVar17 = (z->s).img_n;
          if ((int)uVar17 < 1) {
            uVar29 = 0;
          }
          else {
            uVar29 = 0;
            paVar24 = paVar1;
            do {
              if (paVar24->id == iVar8) goto LAB_0015568c;
              uVar29 = uVar29 + 1;
              paVar24 = paVar24 + 1;
            } while (uVar17 != uVar29);
            uVar29 = (ulong)uVar17;
          }
LAB_0015568c:
          if ((uint)uVar29 == uVar17) goto LAB_00155b38;
          z->img_comp[uVar29 & 0xffffffff].hd = (int)uVar9 >> 4;
          if ((3 < (int)uVar9 >> 4) ||
             (paVar1[uVar29 & 0xffffffff].ha = uVar9 & 0xf, 3 < (uVar9 & 0xf))) goto LAB_00155b2a;
          z->order[lVar22] = (uint)uVar29;
          lVar22 = lVar22 + 1;
        } while (lVar22 < z->scan_n);
      }
      iVar8 = get8(&z->s);
      if (iVar8 == 0) {
        get8(&z->s);
        iVar8 = get8(&z->s);
        if (iVar8 == 0) {
          z->code_buffer = 0;
          z->code_bits = 0;
          z->nomore = 0;
          z->img_comp[2].dc_pred = 0;
          z->img_comp[1].dc_pred = 0;
          z->img_comp[0].dc_pred = 0;
          z->marker = 0xff;
          iVar8 = z->restart_interval;
          if (iVar8 == 0) {
            iVar8 = 0x7fffffff;
          }
          z->todo = iVar8;
          if (z->scan_n == 1) {
            iVar19 = z->order[0];
            uVar29 = (ulong)iVar19;
            iVar26 = z->img_comp[uVar29].y + 7 >> 3;
            bVar16 = 0 < iVar26;
            iVar8 = iVar19;
            if (0 < iVar26) {
              uVar17 = paVar1[uVar29].x + 7 >> 3;
              bVar16 = true;
              iVar21 = 0;
              iVar12 = 0;
              uVar18 = uVar29;
              do {
                if (0 < (int)uVar17) {
                  lVar22 = 0;
                  do {
                    iVar8 = decode_block(z,local_f8,z->huff_dc + paVar1[uVar29].hd,
                                         z->huff_ac + paVar1[uVar29].ha,iVar19);
                    if (iVar8 == 0) {
                      iVar8 = 0;
                      goto joined_r0x00155af1;
                    }
                    idct_block(paVar1[uVar29].data + lVar22 + iVar21 * paVar1[uVar29].w2,
                               paVar1[uVar29].w2,local_f8,z->dequant[paVar1[uVar29].tq]);
                    uVar9 = z->todo;
                    uVar18 = (ulong)uVar9;
                    z->todo = uVar9 - 1;
                    if ((int)uVar9 < 2) {
                      if (z->code_bits < 0x18) {
                        grow_buffer_unsafe(z);
                      }
                      if ((z->marker & 0xf8) != 0xd0) {
                        iVar8 = 1;
                        goto joined_r0x00155af1;
                      }
                      z->code_buffer = 0;
                      z->code_bits = 0;
                      z->nomore = 0;
                      z->img_comp[2].dc_pred = 0;
                      z->img_comp[1].dc_pred = 0;
                      z->img_comp[0].dc_pred = 0;
                      z->marker = 0xff;
                      uVar18 = (ulong)(uint)z->restart_interval;
                      if (z->restart_interval == 0) {
                        uVar18 = 0x7fffffff;
                      }
                      z->todo = (int)uVar18;
                    }
                    lVar22 = lVar22 + 8;
                  } while ((ulong)uVar17 * 8 - lVar22 != 0);
                }
                iVar8 = (int)uVar18;
                iVar12 = iVar12 + 1;
                iVar21 = iVar21 + 8;
                bVar16 = iVar12 < iVar26;
              } while (iVar12 != iVar26);
            }
          }
          else {
            bVar16 = 0 < z->img_mcu_y;
            if (0 < z->img_mcu_y) {
              iVar8 = 0;
              bVar16 = true;
              do {
                if (0 < z->img_mcu_x) {
                  iVar19 = 0;
                  do {
                    if (0 < z->scan_n) {
                      lVar22 = 0;
                      do {
                        iVar26 = z->order[lVar22];
                        if (0 < z->img_comp[iVar26].v) {
                          iVar12 = 0;
                          bVar7 = true;
                          do {
                            iVar21 = paVar1[iVar26].h;
                            if (0 < iVar21) {
                              iVar27 = 0;
                              do {
                                iVar3 = paVar1[iVar26].v;
                                iVar10 = decode_block(z,local_f8,z->huff_dc + paVar1[iVar26].hd,
                                                      z->huff_ac + paVar1[iVar26].ha,iVar26);
                                if (iVar10 == 0) {
                                  if (!bVar7) goto LAB_00155a08;
                                  iVar8 = 0;
                                  goto joined_r0x00155af1;
                                }
                                idct_block(paVar1[iVar26].data +
                                           (long)((iVar21 * iVar19 + iVar27) * 8) +
                                           (long)((iVar3 * iVar8 + iVar12) * paVar1[iVar26].w2 * 8),
                                           paVar1[iVar26].w2,local_f8,z->dequant[paVar1[iVar26].tq])
                                ;
                                iVar27 = iVar27 + 1;
                                iVar21 = paVar1[iVar26].h;
                              } while (iVar27 < iVar21);
                            }
                            iVar12 = iVar12 + 1;
                            bVar7 = iVar12 < paVar1[iVar26].v;
                          } while (iVar12 < paVar1[iVar26].v);
                        }
LAB_00155a08:
                        lVar22 = lVar22 + 1;
                      } while (lVar22 < z->scan_n);
                    }
                    iVar26 = z->todo;
                    z->todo = iVar26 + -1;
                    if (iVar26 < 2) {
                      if (z->code_bits < 0x18) {
                        grow_buffer_unsafe(z);
                      }
                      if ((z->marker & 0xf8) != 0xd0) {
                        iVar8 = 1;
                        goto joined_r0x00155af1;
                      }
                      z->code_buffer = 0;
                      z->code_bits = 0;
                      z->nomore = 0;
                      z->img_comp[2].dc_pred = 0;
                      z->img_comp[1].dc_pred = 0;
                      z->img_comp[0].dc_pred = 0;
                      z->marker = 0xff;
                      iVar26 = z->restart_interval;
                      if (iVar26 == 0) {
                        iVar26 = 0x7fffffff;
                      }
                      z->todo = iVar26;
                    }
                    iVar19 = iVar19 + 1;
                  } while (iVar19 < z->img_mcu_x);
                }
                iVar8 = iVar8 + 1;
                bVar16 = iVar8 < z->img_mcu_y;
              } while (iVar8 < z->img_mcu_y);
            }
            iVar8 = 0;
          }
joined_r0x00155af1:
          if (!bVar16) {
            iVar8 = 1;
          }
          goto LAB_001555eb;
        }
      }
    }
LAB_00155b2a:
    failure_reason = "Corrupt JPEG";
  }
LAB_00155b38:
  cleanup_jpeg(z);
  return (uint8 *)0x0;
}

Assistant:

static uint8 *load_jpeg_image(jpeg *z, int *out_x, int *out_y, int *comp, int req_comp)
{
   int n, decode_n;
   // validate req_comp
   if (req_comp < 0 || req_comp > 4) return epuc("bad req_comp", "Internal error");
   z->s.img_n = 0;

   // load a jpeg image from whichever source
   if (!decode_jpeg_image(z)) { cleanup_jpeg(z); return NULL; }

   // determine actual number of components to generate
   n = req_comp ? req_comp : z->s.img_n;

   if (z->s.img_n == 3 && n < 3)
      decode_n = 1;
   else
      decode_n = z->s.img_n;

   // resample and color-convert
   {
      int k;
      uint i,j;
      uint8 *output;
      uint8 *coutput[4];

      stbi_resample res_comp[4];

      for (k=0; k < decode_n; ++k) {
         stbi_resample *r = &res_comp[k];

         // allocate line buffer big enough for upsampling off the edges
         // with upsample factor of 4
         z->img_comp[k].linebuf = (uint8 *) malloc(z->s.img_x + 3);
         if (!z->img_comp[k].linebuf) { cleanup_jpeg(z); return epuc("outofmem", "Out of memory"); }

         r->hs      = z->img_h_max / z->img_comp[k].h;
         r->vs      = z->img_v_max / z->img_comp[k].v;
         r->ystep   = r->vs >> 1;
         r->w_lores = (z->s.img_x + r->hs-1) / r->hs;
         r->ypos    = 0;
         r->line0   = r->line1 = z->img_comp[k].data;

         if      (r->hs == 1 && r->vs == 1) r->resample = resample_row_1;
         else if (r->hs == 1 && r->vs == 2) r->resample = resample_row_v_2;
         else if (r->hs == 2 && r->vs == 1) r->resample = resample_row_h_2;
         else if (r->hs == 2 && r->vs == 2) r->resample = resample_row_hv_2;
         else                               r->resample = resample_row_generic;
      }

      // can't error after this so, this is safe
      output = (uint8 *) malloc(n * z->s.img_x * z->s.img_y + 1);
      if (!output) { cleanup_jpeg(z); return epuc("outofmem", "Out of memory"); }

      // now go ahead and resample
      for (j=0; j < z->s.img_y; ++j) {
         uint8 *out = output + n * z->s.img_x * j;
         for (k=0; k < decode_n; ++k) {
            stbi_resample *r = &res_comp[k];
            int y_bot = r->ystep >= (r->vs >> 1);
            coutput[k] = r->resample(z->img_comp[k].linebuf,
                                     y_bot ? r->line1 : r->line0,
                                     y_bot ? r->line0 : r->line1,
                                     r->w_lores, r->hs);
            if (++r->ystep >= r->vs) {
               r->ystep = 0;
               r->line0 = r->line1;
               if (++r->ypos < z->img_comp[k].y)
                  r->line1 += z->img_comp[k].w2;
            }
         }
         if (n >= 3) {
            uint8 *y = coutput[0];
            if (z->s.img_n == 3) {
               #if STBI_SIMD
               stbi_YCbCr_installed(out, y, coutput[1], coutput[2], z->s.img_x, n);
               #else
               YCbCr_to_RGB_row(out, y, coutput[1], coutput[2], z->s.img_x, n);
               #endif
            } else
               for (i=0; i < z->s.img_x; ++i) {
                  out[0] = out[1] = out[2] = y[i];
                  out[3] = 255; // not used if n==3
                  out += n;
               }
         } else {
            uint8 *y = coutput[0];
            if (n == 1)
               for (i=0; i < z->s.img_x; ++i) out[i] = y[i];
            else
               for (i=0; i < z->s.img_x; ++i) *out++ = y[i], *out++ = 255;
         }
      }
      cleanup_jpeg(z);
      *out_x = z->s.img_x;
      *out_y = z->s.img_y;
      if (comp) *comp  = z->s.img_n; // report original components, not output
      return output;
   }
}